

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadBlif.c
# Opt level: O2

int Psr_ManReadList(Psr_Man_t *p,Vec_Int_t *vOrder,int Type)

{
  int Entry;
  int Value;
  bool bVar1;
  
  (p->vTemp).nSize = 0;
  while( true ) {
    Entry = Psr_ManReadName(p);
    if (Entry == 0) break;
    Vec_IntPush(&p->vTemp,Entry);
    Vec_IntPush(vOrder,Type + Entry * 4);
  }
  bVar1 = (p->vTemp).nSize == 0;
  if (bVar1) {
    Psr_ManErrorSet(p,"Signal list is empty.",Value);
  }
  return (uint)bVar1;
}

Assistant:

static inline int Psr_ManReadList( Psr_Man_t * p, Vec_Int_t * vOrder, int Type )
{
    int iToken;
    Vec_IntClear( &p->vTemp );
    while ( (iToken = Psr_ManReadName(p)) )
    {
        Vec_IntPush( &p->vTemp, iToken );
        Vec_IntPush( vOrder, Abc_Var2Lit2(iToken, Type) );
    }
    if ( Vec_IntSize(&p->vTemp) == 0 )                return Psr_ManErrorSet(p, "Signal list is empty.", 1);
    return 0;
}